

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

void __thiscall sznet::net::Buffer::makeSpace(Buffer *this,size_t len)

{
  pointer pcVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = this->m_writerIndex;
  uVar3 = this->m_nCheapPrepend;
  uVar4 = this->m_readerIndex;
  if ((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish + uVar4 + (-(long)pcVar1 - sVar2) < (pointer)(uVar3 + len))
  {
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,sVar2 + len);
    this->m_wrapSize =
         (ulong)(((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                 (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) * 3) >> 2;
  }
  else {
    if (uVar4 <= uVar3) {
      __assert_fail("m_nCheapPrepend < m_readerIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                    ,0x18e,"void sznet::net::Buffer::makeSpace(size_t)");
    }
    memmove(pcVar1 + uVar3,pcVar1 + uVar4,sVar2 - uVar4);
    this->m_readerIndex = this->m_nCheapPrepend;
    this->m_writerIndex = (sVar2 - uVar4) + this->m_nCheapPrepend;
  }
  return;
}

Assistant:

void makeSpace(size_t len)
	{
		if (writableBytes() + prependableBytes() < len + m_nCheapPrepend)
		{
			// ������ȷʵ������
			// FIXME: move readable data
			m_buffer.resize(m_writerIndex + len);
			m_wrapSize = m_buffer.capacity() * 3 / 4;
		}
		else
		{
			// ����
			assert(m_nCheapPrepend < m_readerIndex);
			wrapBuffer();
		}
	}